

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void * fts5ApiGetAuxdata(Fts5Context *pCtx,int bClear)

{
  void *pvVar1;
  long *plVar2;
  
  plVar2 = *(long **)(pCtx + 0x98);
  if (plVar2 == (long *)0x0) {
    return (void *)0x0;
  }
  do {
    if (*plVar2 == *(long *)(pCtx + 0x90)) {
      pvVar1 = (void *)plVar2[1];
      if (bClear == 0) {
        return pvVar1;
      }
      plVar2[1] = 0;
      plVar2[2] = 0;
      return pvVar1;
    }
    plVar2 = (long *)plVar2[3];
  } while (plVar2 != (long *)0x0);
  return (void *)0x0;
}

Assistant:

static void *fts5ApiGetAuxdata(Fts5Context *pCtx, int bClear){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5Auxdata *pData;
  void *pRet = 0;

  for(pData=pCsr->pAuxdata; pData; pData=pData->pNext){
    if( pData->pAux==pCsr->pAux ) break;
  }

  if( pData ){
    pRet = pData->pPtr;
    if( bClear ){
      pData->pPtr = 0;
      pData->xDelete = 0;
    }
  }

  return pRet;
}